

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.h
# Opt level: O2

string * convertNumberToString(string *__return_storage_ptr__,string *input)

{
  uint uVar1;
  char cVar2;
  pointer pcVar3;
  size_type sVar4;
  invalid_argument *this;
  size_type __n;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (input->_M_dataplus)._M_p;
  sVar4 = input->_M_string_length;
  sVar5 = 0;
  do {
    if (sVar4 == sVar5) {
      return __return_storage_ptr__;
    }
    cVar2 = pcVar3[sVar5];
    uVar1 = (int)cVar2 - 0x30;
    if (uVar1 < 10) {
      __n = (size_type)uVar1;
    }
    else {
      __n = 10;
      if (cVar2 != '.') {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_50,input," is not a valid number!");
        std::invalid_argument::invalid_argument(this,(string *)&local_50);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at(&spelledDigits_abi_cxx11_,__n);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    sVar5 = sVar5 + 1;
  } while( true );
}

Assistant:

std::string convertNumberToString(const std::string& input)
{
	std::string result{};
	constexpr auto dotPosition = 10;
	for (auto&& c : input)
	{
		if (std::isdigit(c))
			result += spelledDigits.at(c - '0');
		else if (c == '.')
			result += spelledDigits.at(dotPosition);
		else
			throw std::invalid_argument(input + " is not a valid number!");
		result += ' ';
	}
	return result;
}